

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

date_t duckdb::LastDayOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(timestamp_t input)

{
  date_t dVar1;
  
  dVar1 = Timestamp::GetDate(input);
  dVar1 = Operation<duckdb::date_t,duckdb::date_t>(dVar1);
  return (date_t)dVar1.days;
}

Assistant:

date_t LastDayOperator::Operation(timestamp_t input) {
	return LastDayOperator::Operation<date_t, date_t>(Timestamp::GetDate(input));
}